

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::eraseImpl
          (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *this,
          size_t pos)

{
  size_t sVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  long lVar5;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  uint row;
  long local_78;
  long local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  SearchKey local_58;
  Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *local_50;
  Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  
  local_40 = &local_78;
  local_78 = *(long *)this;
  puVar2 = (undefined8 *)(local_78 + pos * 0x10);
  local_68 = *puVar2;
  uStack_60 = puVar2[1];
  local_70 = *(long *)(this + 8) - local_78 >> 4;
  local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00224978;
  row = (uint)pos;
  local_50 = (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *)
             CONCAT44(local_50._4_4_,row);
  local_48 = this + 0x20;
  local_38 = &local_68;
  _::BTreeImpl::erase((BTreeImpl *)(this + 0x28),row,&local_58);
  local_78 = *(long *)this;
  lVar5 = *(long *)(this + 8);
  local_70 = lVar5 - local_78 >> 4;
  sVar1 = local_70 - 1;
  if (sVar1 != pos) {
    puVar2 = (undefined8 *)(local_78 + sVar1 * 0x10);
    local_68 = *puVar2;
    uStack_60 = puVar2[1];
    local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00224938;
    local_50 = this + 0x20;
    local_48 = (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *)
               &local_78;
    local_40 = &local_68;
    _::BTreeImpl::renumber((BTreeImpl *)(this + 0x28),(uint)sVar1,row,&local_58);
    puVar2 = (undefined8 *)(*(long *)this + sVar1 * 0x10);
    uVar4 = puVar2[1];
    puVar3 = (undefined8 *)(*(long *)this + pos * 0x10);
    *puVar3 = *puVar2;
    puVar3[1] = uVar4;
    lVar5 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar5 + -0x10;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}